

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

void ft_var_load_avar(TT_Face face)

{
  int iVar1;
  FT_UShort FVar2;
  GX_AVarCorrespondence pGVar3;
  FT_Pointer pvVar4;
  FT_ULong local_58;
  FT_ULong table_len;
  FT_Int j;
  FT_Int i;
  FT_Long axisCount;
  FT_Long version;
  GX_AVarCorrespondence pGStack_30;
  FT_Error error;
  GX_AVarSegment segment;
  GX_Blend blend;
  FT_Memory memory;
  FT_Stream stream;
  TT_Face face_local;
  
  memory = (FT_Memory)(face->root).stream;
  blend = (GX_Blend)((FT_Stream)memory)->memory;
  segment = (GX_AVarSegment)face->blend;
  version._4_4_ = 0;
  ((GX_Blend)segment)->avar_loaded = '\x01';
  stream = (FT_Stream)face;
  version._4_4_ = (*face->goto_table)(face,0x61766172,(FT_Stream)memory,&local_58);
  if (version._4_4_ != 0) {
    return;
  }
  version._4_4_ = FT_Stream_EnterFrame((FT_Stream)memory,local_58);
  if (version._4_4_ != 0) {
    return;
  }
  axisCount = FT_Stream_GetULong((FT_Stream)memory);
  _j = FT_Stream_GetULong((FT_Stream)memory);
  if ((axisCount == 0x10000) && (_j == (uint)(segment[1].correspondence)->fromCoord)) {
    pGVar3 = (GX_AVarCorrespondence)
             ft_mem_realloc((FT_Memory)blend,0x10,0,_j,(void *)0x0,(FT_Error *)((long)&version + 4))
    ;
    segment[3].correspondence = pGVar3;
    if (version._4_4_ == 0) {
      pGStack_30 = segment[3].correspondence;
      for (table_len._4_4_ = 0; (long)table_len._4_4_ < (long)_j;
          table_len._4_4_ = table_len._4_4_ + 1) {
        FVar2 = FT_Stream_GetUShort((FT_Stream)memory);
        *(FT_UShort *)&pGStack_30->fromCoord = FVar2;
        iVar1 = table_len._4_4_;
        if (local_58 < (ulong)(ushort)pGStack_30->fromCoord << 2) goto LAB_001a8022;
        pvVar4 = ft_mem_realloc((FT_Memory)blend,0x10,0,(ulong)(ushort)pGStack_30->fromCoord,
                                (void *)0x0,(FT_Error *)((long)&version + 4));
        pGStack_30->toCoord = (FT_Fixed)pvVar4;
        iVar1 = table_len._4_4_;
        if (version._4_4_ != 0) goto LAB_001a8022;
        for (table_len._0_4_ = 0; (int)table_len < (int)(uint)(ushort)pGStack_30->fromCoord;
            table_len._0_4_ = (int)table_len + 1) {
          FVar2 = FT_Stream_GetUShort((FT_Stream)memory);
          *(long *)(pGStack_30->toCoord + (long)(int)table_len * 0x10) =
               (long)((int)(short)FVar2 << 2);
          FVar2 = FT_Stream_GetUShort((FT_Stream)memory);
          *(long *)(pGStack_30->toCoord + (long)(int)table_len * 0x10 + 8) =
               (long)((int)(short)FVar2 << 2);
        }
        pGStack_30 = pGStack_30 + 1;
      }
    }
  }
LAB_001a8135:
  FT_Stream_ExitFrame((FT_Stream)memory);
  return;
LAB_001a8022:
  while (table_len._0_4_ = iVar1 + -1, -1 < (int)table_len) {
    ft_mem_free((FT_Memory)blend,(void *)segment[3].correspondence[(int)table_len].toCoord);
    segment[3].correspondence[(int)table_len].toCoord = 0;
    iVar1 = (int)table_len;
  }
  ft_mem_free((FT_Memory)blend,segment[3].correspondence);
  segment[3].correspondence = (GX_AVarCorrespondence)0x0;
  segment[3].correspondence = (GX_AVarCorrespondence)0x0;
  goto LAB_001a8135;
}

Assistant:

static void
  ft_var_load_avar( TT_Face  face )
  {
    FT_Stream       stream = FT_FACE_STREAM( face );
    FT_Memory       memory = stream->memory;
    GX_Blend        blend  = face->blend;
    GX_AVarSegment  segment;
    FT_Error        error = FT_Err_Ok;
    FT_Long         version;
    FT_Long         axisCount;
    FT_Int          i, j;
    FT_ULong        table_len;

    FT_UNUSED( error );


    FT_TRACE2(( "AVAR " ));

    blend->avar_loaded = TRUE;
    error = face->goto_table( face, TTAG_avar, stream, &table_len );
    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));
      return;
    }

    if ( FT_FRAME_ENTER( table_len ) )
      return;

    version   = FT_GET_LONG();
    axisCount = FT_GET_LONG();

    if ( version != 0x00010000L )
    {
      FT_TRACE2(( "bad table version\n" ));
      goto Exit;
    }

    FT_TRACE2(( "loaded\n" ));

    if ( axisCount != (FT_Long)blend->mmvar->num_axis )
    {
      FT_TRACE2(( "ft_var_load_avar: number of axes in `avar' and `fvar'\n"
                  "                  table are different\n" ));
      goto Exit;
    }

    if ( FT_NEW_ARRAY( blend->avar_segment, axisCount ) )
      goto Exit;

    segment = &blend->avar_segment[0];
    for ( i = 0; i < axisCount; i++, segment++ )
    {
      FT_TRACE5(( "  axis %d:\n", i ));

      segment->pairCount = FT_GET_USHORT();
      if ( (FT_ULong)segment->pairCount * 4 > table_len                ||
           FT_NEW_ARRAY( segment->correspondence, segment->pairCount ) )
      {
        /* Failure.  Free everything we have done so far.  We must do */
        /* it right now since loading the `avar' table is optional.   */

        for ( j = i - 1; j >= 0; j-- )
          FT_FREE( blend->avar_segment[j].correspondence );

        FT_FREE( blend->avar_segment );
        blend->avar_segment = NULL;
        goto Exit;
      }

      for ( j = 0; j < segment->pairCount; j++ )
      {
        /* convert to Fixed */
        segment->correspondence[j].fromCoord = FT_GET_SHORT() * 4;
        segment->correspondence[j].toCoord   = FT_GET_SHORT() * 4;

        FT_TRACE5(( "    mapping %.5f to %.5f\n",
                    segment->correspondence[j].fromCoord / 65536.0,
                    segment->correspondence[j].toCoord / 65536.0 ));
      }

      FT_TRACE5(( "\n" ));
    }

  Exit:
    FT_FRAME_EXIT();
  }